

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O3

void change_state(AVxWorker *worker,AVxWorkerStatus new_status)

{
  AVxWorkerStatus AVar1;
  
  if ((pthread_mutex_t *)worker->impl_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)worker->impl_);
    AVar1 = worker->status_;
    if (AVar1 != AVX_WORKER_STATUS_NOT_OK) {
      while (AVar1 != AVX_WORKER_STATUS_OK) {
        pthread_cond_wait((pthread_cond_t *)((pthread_mutex_t *)worker->impl_ + 1),
                          (pthread_mutex_t *)worker->impl_);
        AVar1 = worker->status_;
      }
      if (new_status != AVX_WORKER_STATUS_OK) {
        worker->status_ = new_status;
        pthread_cond_signal((pthread_cond_t *)&worker->impl_->condition_);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)worker->impl_);
    return;
  }
  return;
}

Assistant:

static void change_state(AVxWorker *const worker, AVxWorkerStatus new_status) {
  // No-op when attempting to change state on a thread that didn't come up.
  // Checking status_ without acquiring the lock first would result in a data
  // race.
  if (worker->impl_ == NULL) return;

  pthread_mutex_lock(&worker->impl_->mutex_);
  if (worker->status_ >= AVX_WORKER_STATUS_OK) {
    // wait for the worker to finish
    while (worker->status_ != AVX_WORKER_STATUS_OK) {
      pthread_cond_wait(&worker->impl_->condition_, &worker->impl_->mutex_);
    }
    // assign new status and release the working thread if needed
    if (new_status != AVX_WORKER_STATUS_OK) {
      worker->status_ = new_status;
      pthread_cond_signal(&worker->impl_->condition_);
    }
  }
  pthread_mutex_unlock(&worker->impl_->mutex_);
}